

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_util_test.c
# Opt level: O3

_Bool test_uo_temp_strcat(void)

{
  char *__s2;
  long lVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  long *in_FS_OFFSET;
  
  lVar1 = *in_FS_OFFSET;
  __s2 = (char *)(lVar1 + -0x1000);
  *(undefined4 *)(in_FS_OFFSET + -0x1ff) = 0x6d7573;
  if (__s2 != "lorem ip") {
    in_FS_OFFSET[-0x200] = 0x7069206d65726f6c;
  }
  iVar2 = strcmp("lorem ipsum",__s2);
  *(undefined1 *)((long)in_FS_OFFSET + -0xff5) = 0;
  *(undefined2 *)(lVar1 + -0xff8) = 0x7573;
  *(undefined1 *)(lVar1 + -0xff6) = 0x6d;
  if (__s2 != "lorem ip") {
    in_FS_OFFSET[-0x200] = 0x7069206d65726f6c;
  }
  sVar4 = strlen(__s2);
  if (sVar4 + 5 < 0x1000) {
    *(undefined1 *)((long)in_FS_OFFSET + (sVar4 - 0xffb)) = 0;
    *(undefined1 *)(lVar1 + -0xffc + sVar4) = 0x66;
    builtin_strncpy(__s2 + sVar4," asd",4);
    iVar3 = strcmp("lorem ipsum asdf",__s2);
    return iVar3 == 0 && iVar2 == 0;
  }
  __assert_fail("len < UO_TEMPSTR_LEN",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UoLeevi[P]libuo/uo_util/src/include/uo_util/uo_util.h"
                ,0x4b,"char *uo_temp_strcat(const char *, const char *)");
}

Assistant:

bool test_uo_temp_strcat(void)
{
    bool passed = true;

    passed &= strcmp("lorem ipsum", uo_temp_strcat("lorem ip", "sum")) == 0;

    char *temp = uo_temp_strcat("lorem ip", "sum");
    uo_temp_strcat(temp, " asdf");
    passed &= strcmp("lorem ipsum asdf", temp) == 0;

    return passed;
}